

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

void __thiscall
llvm::SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer(SmallVectorMemoryBuffer *this)

{
  SmallVectorMemoryBuffer *this_local;
  
  ~SmallVectorMemoryBuffer(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer() {}